

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

int callbinTM(lua_State *L,TValue *p1,TValue *p2,StkId res,TMS event)

{
  byte bVar1;
  TValue *local_40;
  TValue *tm;
  TMS event_local;
  StkId res_local;
  TValue *p2_local;
  TValue *p1_local;
  lua_State *L_local;
  
  local_40 = luaT_gettmbyobj(L,p1,event);
  if ((local_40->tt_ & 0xf) == 0) {
    local_40 = luaT_gettmbyobj(L,p2,event);
  }
  if ((local_40->tt_ & 0xf) == 0) {
    L_local._4_4_ = 0xffffffff;
  }
  else {
    bVar1 = luaT_callTMres(L,local_40,p1,p2,res);
    L_local._4_4_ = (uint)bVar1;
  }
  return L_local._4_4_;
}

Assistant:

static int callbinTM (lua_State *L, const TValue *p1, const TValue *p2,
                      StkId res, TMS event) {
  const TValue *tm = luaT_gettmbyobj(L, p1, event);  /* try first operand */
  if (notm(tm))
    tm = luaT_gettmbyobj(L, p2, event);  /* try second operand */
  if (notm(tm))
    return -1;  /* tag method not found */
  else  /* call tag method and return the tag of the result */
    return luaT_callTMres(L, tm, p1, p2, res);
}